

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

size_t __thiscall
Gudhi::Simplex_tree<Simplex_tree_vec_fil>::num_simplices_and_filtration_serialization_size
          (Simplex_tree<Simplex_tree_vec_fil> *this,Siblings *sib,size_t *fv_byte_size)

{
  Siblings *sib_00;
  pointer bg;
  size_t sVar1;
  pointer ppVar2;
  size_t sVar3;
  const_iterator sh;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  local_30;
  
  local_30.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>
        *)(sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  sVar3 = (sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  ppVar2 = (pointer)local_30.m_ptr + sVar3;
  while (local_30.m_ptr !=
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>
          *)ppVar2) {
    *fv_byte_size =
         (long)*(pointer *)
                ((long)&((local_30.m_ptr)->second).super_Filtration_simplex_base.filt_.
                        super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8) +
         (*fv_byte_size -
         (long)((local_30.m_ptr)->second).super_Filtration_simplex_base.filt_.
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start) + 8;
    sib_00 = ((local_30.m_ptr)->second).children_;
    if (sib_00->parent_ == (local_30.m_ptr)->first) {
      sVar1 = num_simplices_and_filtration_serialization_size(this,sib_00,fv_byte_size);
      sVar3 = sVar3 + sVar1;
    }
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
    ::operator++(&local_30);
  }
  return sVar3;
}

Assistant:

std::size_t num_simplices_and_filtration_serialization_size(Siblings const* sib, std::size_t& fv_byte_size) const {
    using namespace Gudhi::simplex_tree;
    
    auto sib_begin = sib->members().begin();
    auto sib_end = sib->members().end();
    size_t simplices_number = sib->members().size();
    for (auto sh = sib_begin; sh != sib_end; ++sh) {
      if constexpr (SimplexTreeOptions::store_filtration)
        fv_byte_size += get_serialization_size_of(sh->second.filtration());
      if (has_children(sh)) {
        simplices_number += num_simplices_and_filtration_serialization_size(sh->second.children(), fv_byte_size);
      }
    }
    return simplices_number;
  }